

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

strbuf * ssh_cipher_encrypt_length_wrapper(ssh_cipher *c,ptrlen input,unsigned_long seq)

{
  strbuf *psVar1;
  ptrlen string;
  
  if (input.len == 4) {
    string.len = 4;
    string.ptr = input.ptr;
    psVar1 = strbuf_dup(string);
    (*c->vt->encrypt_length)(c,psVar1->u,(int)psVar1->len,seq);
    return psVar1;
  }
  fatal_error("ssh_cipher_encrypt_length: needs exactly 4 bytes");
}

Assistant:

strbuf *ssh_cipher_encrypt_length_wrapper(ssh_cipher *c, ptrlen input,
                                           unsigned long seq)
{
    if (input.len != 4)
        fatal_error("ssh_cipher_encrypt_length: needs exactly 4 bytes");
    strbuf *sb = strbuf_dup(input);
    ssh_cipher_encrypt_length(c, sb->u, sb->len, seq);
    return sb;
}